

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  uchar *puVar1;
  uchar *puVar2;
  byte bVar3;
  byte bVar4;
  undefined4 uVar5;
  uchar *puVar6;
  long lVar7;
  ImFont *pIVar8;
  byte bVar9;
  ushort uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uchar *puVar14;
  uchar *puVar15;
  ulong uVar16;
  int iVar17;
  uchar *__dest;
  byte *pbVar18;
  byte *pbVar19;
  ImFontConfig font_cfg;
  ImFontConfig local_148;
  ImFontConfig local_b8;
  
  iVar17 = swap_bytes(*(undefined4 *)((long)compressed_ttf_data + 8));
  puVar6 = (uchar *)ImGui::MemAlloc(CONCAT44((int)((ulong)this >> 0x20),iVar17));
  iVar11 = swap_bytes(*compressed_ttf_data);
  if (iVar11 == 0x57bc0000) {
    iVar11 = swap_bytes(*(undefined4 *)((long)compressed_ttf_data + 4));
    if (iVar11 == 0) {
      uVar5 = swap_bytes(*(undefined4 *)((long)compressed_ttf_data + 8));
      lVar7 = CONCAT44((int)((ulong)puVar6 >> 0x20),uVar5);
      puVar2 = puVar6 + lVar7 + 1;
      puVar1 = puVar6 + lVar7;
      __dest = puVar6;
      pbVar18 = (byte *)((long)compressed_ttf_data + 0x10);
      stb__barrier_in_b = (uchar *)compressed_ttf_data;
      stb__barrier_out_e = puVar1;
      stb__barrier_out_b = puVar6;
      stb__dout = puVar6;
      do {
        bVar3 = *pbVar18;
        uVar16 = (ulong)bVar3;
        uVar12 = (uint)bVar3;
        if (bVar3 < 0x20) {
          if (bVar3 < 0x18) {
            if (bVar3 < 0x10) {
              if (bVar3 < 8) {
                if (bVar3 == 4) {
                  uVar10 = swap_bytes(*(undefined2 *)(pbVar18 + 4));
                  puVar15 = __dest + (ulong)uVar10 + 1;
                  if (__dest + (ulong)uVar10 + 1 <= puVar1) {
                    bVar3 = pbVar18[1];
                    bVar9 = pbVar18[2];
                    bVar4 = pbVar18[3];
                    puVar15 = puVar2;
                    if (puVar6 <= __dest + ~((ulong)bVar3 * 0x10000 + (ulong)bVar4 |
                                            (ulong)bVar9 * 0x100)) {
                      iVar11 = uVar10 + 1;
                      do {
                        puVar15 = __dest + 1;
                        iVar11 = iVar11 + -1;
                        *__dest = __dest[~((ulong)bVar4 + (ulong)bVar9 * 0x100) +
                                         (ulong)bVar3 * -0x10000];
                        __dest = puVar15;
                      } while (iVar11 != 0);
                    }
                  }
                  pbVar19 = pbVar18 + 6;
                  stb__dout = puVar15;
                }
                else {
                  if (uVar12 != 6) {
                    if (uVar12 == 7) {
                      uVar10 = swap_bytes(*(undefined2 *)(pbVar18 + 1));
                      uVar16 = (ulong)uVar10;
                      puVar15 = __dest + uVar16 + 1;
                      puVar14 = puVar15;
                      if ((puVar15 <= puVar1) &&
                         (puVar14 = puVar2, compressed_ttf_data <= pbVar18 + 3)) {
                        memcpy(__dest,pbVar18 + 3,uVar16 + 1);
                        uVar10 = swap_bytes(*(undefined2 *)(pbVar18 + 1));
                        uVar16 = (ulong)uVar10;
                        puVar14 = puVar15;
                      }
                      lVar7 = 4;
                      stb__dout = puVar14;
                      goto LAB_00242881;
                    }
                    break;
                  }
                  puVar15 = __dest + (ulong)pbVar18[4] + 1;
                  if (__dest + (ulong)pbVar18[4] + 1 <= puVar1) {
                    bVar3 = pbVar18[1];
                    bVar9 = pbVar18[2];
                    bVar4 = pbVar18[3];
                    puVar15 = puVar2;
                    if (puVar6 <= __dest + ~((ulong)bVar3 * 0x10000 + (ulong)bVar4 |
                                            (ulong)bVar9 * 0x100)) {
                      uVar16 = (ulong)pbVar18[4] + 1;
                      do {
                        puVar15 = __dest + 1;
                        uVar12 = (int)uVar16 - 1;
                        uVar16 = (ulong)uVar12;
                        *__dest = __dest[~((ulong)bVar4 + (ulong)bVar9 * 0x100) +
                                         (ulong)bVar3 * -0x10000];
                        __dest = puVar15;
                      } while (uVar12 != 0);
                    }
                  }
                  pbVar19 = pbVar18 + 5;
                  stb__dout = puVar15;
                }
              }
              else {
                bVar9 = pbVar18[1];
                uVar16 = (ulong)(uVar12 * 0x100 + -0x7ff + (uint)bVar9);
                puVar15 = __dest + uVar16;
                puVar14 = puVar15;
                if ((puVar15 <= puVar1) && (puVar14 = puVar2, compressed_ttf_data <= pbVar18 + 2)) {
                  memcpy(__dest,pbVar18 + 2,uVar16);
                  bVar3 = *pbVar18;
                  bVar9 = pbVar18[1];
                  puVar14 = puVar15;
                }
                uVar16 = (ulong)CONCAT11(bVar3,bVar9);
                lVar7 = -0x7fd;
                stb__dout = puVar14;
LAB_00242881:
                pbVar19 = pbVar18 + uVar16 + lVar7;
                puVar15 = stb__dout;
                if (pbVar19 == pbVar18) break;
              }
            }
            else {
              uVar10 = swap_bytes(*(undefined2 *)(pbVar18 + 3));
              puVar15 = __dest + (ulong)uVar10 + 1;
              if ((__dest + (ulong)uVar10 + 1 <= puVar1) &&
                 (uVar16 = (ulong)((uint)pbVar18[1] * 0x100 + -0xfffff +
                                  ((uint)pbVar18[2] | (uint)bVar3 << 0x10)), puVar15 = puVar2,
                 puVar6 <= __dest + -uVar16)) {
                iVar11 = uVar10 + 1;
                do {
                  puVar15 = __dest + 1;
                  iVar11 = iVar11 + -1;
                  *__dest = __dest[-uVar16];
                  __dest = puVar15;
                } while (iVar11 != 0);
              }
              pbVar19 = pbVar18 + 5;
              stb__dout = puVar15;
            }
          }
          else {
            puVar15 = __dest + (ulong)pbVar18[3] + 1;
            if ((__dest + (ulong)pbVar18[3] + 1 <= puVar1) &&
               (uVar16 = (ulong)((uint)pbVar18[1] * 0x100 + -0x17ffff +
                                ((uint)pbVar18[2] | (uint)bVar3 << 0x10)), puVar15 = puVar2,
               puVar6 <= __dest + -uVar16)) {
              uVar13 = (ulong)pbVar18[3] + 1;
              do {
                puVar15 = __dest + 1;
                uVar12 = (int)uVar13 - 1;
                uVar13 = (ulong)uVar12;
                *__dest = __dest[-uVar16];
                __dest = puVar15;
              } while (uVar12 != 0);
            }
            pbVar19 = pbVar18 + 4;
            stb__dout = puVar15;
          }
        }
        else if ((char)bVar3 < '\0') {
          uVar12 = uVar12 - 0x7f;
          uVar16 = (ulong)uVar12;
          puVar15 = __dest + uVar16;
          puVar14 = puVar15;
          if ((puVar15 <= puVar1) &&
             (bVar3 = pbVar18[1], puVar15 = puVar2, puVar14 = puVar2,
             puVar6 <= __dest + ~(ulong)bVar3)) {
            while (puVar15 = __dest, puVar14 = stb__dout, uVar12 != 0) {
              stb__dout = __dest + 1;
              uVar12 = (int)uVar16 - 1;
              uVar16 = (ulong)uVar12;
              *__dest = __dest[~(ulong)bVar3];
              __dest = stb__dout;
            }
          }
          stb__dout = puVar14;
          pbVar19 = pbVar18 + 2;
        }
        else {
          if (bVar3 < 0x40) {
            puVar15 = __dest + (uVar12 - 0x1f);
            puVar14 = puVar15;
            if ((puVar15 <= puVar1) && (puVar14 = puVar2, compressed_ttf_data <= pbVar18 + 1)) {
              memcpy(__dest,pbVar18 + 1,(ulong)(uVar12 - 0x1f));
              uVar16 = (ulong)*pbVar18;
              puVar14 = puVar15;
            }
            lVar7 = -0x1e;
            stb__dout = puVar14;
            goto LAB_00242881;
          }
          puVar15 = __dest + (ulong)pbVar18[2] + 1;
          if ((__dest + (ulong)pbVar18[2] + 1 <= puVar1) &&
             (uVar16 = (ulong)((uint)bVar3 * 0x100 + -0x3fff + (uint)pbVar18[1]), puVar15 = puVar2,
             puVar6 <= __dest + -uVar16)) {
            uVar13 = (ulong)pbVar18[2] + 1;
            do {
              puVar15 = __dest + 1;
              uVar12 = (int)uVar13 - 1;
              uVar13 = (ulong)uVar12;
              *__dest = __dest[-uVar16];
              __dest = puVar15;
            } while (uVar12 != 0);
          }
          pbVar19 = pbVar18 + 3;
          stb__dout = puVar15;
        }
        __dest = puVar15;
        pbVar18 = pbVar19;
      } while (puVar15 <= puVar1);
    }
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    ImFontConfig::ImFontConfig(&local_148);
  }
  else {
    local_148.DstFont = font_cfg_template->DstFont;
    local_148.FontData = font_cfg_template->FontData;
    local_148.FontDataSize = font_cfg_template->FontDataSize;
    local_148.FontDataOwnedByAtlas = font_cfg_template->FontDataOwnedByAtlas;
    local_148._13_3_ = *(undefined3 *)&font_cfg_template->field_0xd;
    local_148.FontNo = font_cfg_template->FontNo;
    local_148.SizePixels = font_cfg_template->SizePixels;
    local_148.OversampleH = font_cfg_template->OversampleH;
    local_148.OversampleV = font_cfg_template->OversampleV;
    local_148.PixelSnapH = font_cfg_template->PixelSnapH;
    local_148._33_3_ = *(undefined3 *)&font_cfg_template->field_0x21;
    local_148.GlyphExtraSpacing.x = (font_cfg_template->GlyphExtraSpacing).x;
    local_148._40_8_ = *(undefined8 *)&(font_cfg_template->GlyphExtraSpacing).y;
    local_148._48_8_ = *(undefined8 *)&(font_cfg_template->GlyphOffset).y;
    local_148.GlyphRanges = font_cfg_template->GlyphRanges;
    local_148.GlyphMinAdvanceX = font_cfg_template->GlyphMinAdvanceX;
    local_148.GlyphMaxAdvanceX = font_cfg_template->GlyphMaxAdvanceX;
    local_148.MergeMode = font_cfg_template->MergeMode;
    local_148._73_3_ = *(undefined3 *)&font_cfg_template->field_0x49;
    local_148.RasterizerFlags = font_cfg_template->RasterizerFlags;
    local_148.RasterizerMultiply = font_cfg_template->RasterizerMultiply;
    local_148.EllipsisChar = font_cfg_template->EllipsisChar;
    local_148.Name[0] = font_cfg_template->Name[0];
    local_148.Name[1] = font_cfg_template->Name[1];
    local_148.Name._2_8_ = *(undefined8 *)(font_cfg_template->Name + 2);
    local_148.Name._10_8_ = *(undefined8 *)(font_cfg_template->Name + 10);
    local_148.Name._18_8_ = *(undefined8 *)(font_cfg_template->Name + 0x12);
    local_148.Name._26_8_ = *(undefined8 *)(font_cfg_template->Name + 0x1a);
    local_148._120_8_ = *(undefined8 *)(font_cfg_template->Name + 0x22);
  }
  local_148.FontDataOwnedByAtlas = true;
  local_b8.DstFont = local_148.DstFont;
  local_b8.OversampleH = local_148.OversampleH;
  local_b8.OversampleV = local_148.OversampleV;
  local_b8.PixelSnapH = local_148.PixelSnapH;
  local_b8._33_3_ = local_148._33_3_;
  local_b8.GlyphExtraSpacing.x = local_148.GlyphExtraSpacing.x;
  local_b8.GlyphExtraSpacing.y = local_148.GlyphExtraSpacing.y;
  local_b8.GlyphOffset.x = local_148.GlyphOffset.x;
  local_b8.GlyphOffset.y = local_148.GlyphOffset.y;
  local_b8._52_4_ = local_148._52_4_;
  local_b8.GlyphRanges = local_148.GlyphRanges;
  local_b8.GlyphMinAdvanceX = local_148.GlyphMinAdvanceX;
  local_b8.GlyphMaxAdvanceX = local_148.GlyphMaxAdvanceX;
  local_b8.MergeMode = local_148.MergeMode;
  local_b8._73_3_ = local_148._73_3_;
  local_b8.RasterizerFlags = local_148.RasterizerFlags;
  local_b8.RasterizerMultiply = local_148.RasterizerMultiply;
  local_b8.EllipsisChar = local_148.EllipsisChar;
  local_b8.Name[0] = local_148.Name[0];
  local_b8.Name[1] = local_148.Name[1];
  local_b8.Name[2] = local_148.Name[2];
  local_b8.Name[3] = local_148.Name[3];
  local_b8.Name[4] = local_148.Name[4];
  local_b8.Name[5] = local_148.Name[5];
  local_b8.Name[6] = local_148.Name[6];
  local_b8.Name[7] = local_148.Name[7];
  local_b8.Name[8] = local_148.Name[8];
  local_b8.Name[9] = local_148.Name[9];
  local_b8.Name[10] = local_148.Name[10];
  local_b8.Name[0xb] = local_148.Name[0xb];
  local_b8.Name[0xc] = local_148.Name[0xc];
  local_b8.Name[0xd] = local_148.Name[0xd];
  local_b8.Name[0xe] = local_148.Name[0xe];
  local_b8.Name[0xf] = local_148.Name[0xf];
  local_b8.Name[0x10] = local_148.Name[0x10];
  local_b8.Name[0x11] = local_148.Name[0x11];
  local_b8.Name[0x12] = local_148.Name[0x12];
  local_b8.Name[0x13] = local_148.Name[0x13];
  local_b8.Name[0x14] = local_148.Name[0x14];
  local_b8.Name[0x15] = local_148.Name[0x15];
  local_b8.Name[0x16] = local_148.Name[0x16];
  local_b8.Name[0x17] = local_148.Name[0x17];
  local_b8.Name[0x18] = local_148.Name[0x18];
  local_b8.Name[0x19] = local_148.Name[0x19];
  local_b8.Name[0x1a] = local_148.Name[0x1a];
  local_b8.Name[0x1b] = local_148.Name[0x1b];
  local_b8.Name[0x1c] = local_148.Name[0x1c];
  local_b8.Name[0x1d] = local_148.Name[0x1d];
  local_b8.Name[0x1e] = local_148.Name[0x1e];
  local_b8.Name[0x1f] = local_148.Name[0x1f];
  local_b8.Name[0x20] = local_148.Name[0x20];
  local_b8.Name[0x21] = local_148.Name[0x21];
  local_b8.Name[0x22] = local_148.Name[0x22];
  local_b8.Name[0x23] = local_148.Name[0x23];
  local_b8.Name[0x24] = local_148.Name[0x24];
  local_b8.Name[0x25] = local_148.Name[0x25];
  local_b8.Name[0x26] = local_148.Name[0x26];
  local_b8.Name[0x27] = local_148.Name[0x27];
  local_b8._126_2_ = local_148._126_2_;
  local_b8._12_4_ = local_148._12_4_;
  local_b8.FontDataSize = iVar17;
  local_b8.FontNo = local_148.FontNo;
  local_b8.SizePixels = size_pixels;
  if (glyph_ranges != (ImWchar *)0x0) {
    local_b8.GlyphRanges = glyph_ranges;
  }
  local_b8.FontData = puVar6;
  pIVar8 = AddFont(this,&local_b8);
  return pIVar8;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((const unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char *)IM_ALLOC(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (const unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}